

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::definePrimitive(Forth *this,char *name,Code code,bool setImmediate)

{
  Cell *pCVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  pointer pDVar4;
  size_t __len2;
  Definition *pDVar5;
  undefined7 in_register_00000009;
  size_type sVar6;
  char cVar7;
  char in_R8B;
  Definition local_78;
  
  paVar2 = &local_78.name.field_2;
  local_78.name._M_string_length = 0;
  local_78.name.field_2._M_local_buf[0] = '\0';
  local_78.numberInVector = 0;
  local_78.searchOrder = 0;
  local_78.FlagHidden = 2;
  local_78.FlagImmediate = 4;
  local_78._8_4_ = SUB84(CONCAT71(in_register_00000009,setImmediate),0);
  local_78._12_4_ = SUB74((uint7)in_register_00000009 >> 0x18,0);
  local_78.does = this->dataPointer;
  local_78.flags = 0;
  local_78.parameter = local_78.does;
  local_78.code = code;
  local_78.name._M_dataplus._M_p = (pointer)paVar2;
  __len2 = strlen(name);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&local_78.name,0,0,name,__len2);
  if (local_78.name._M_string_length != 0) {
    sVar6 = 0;
    do {
      cVar3 = local_78.name._M_dataplus._M_p[sVar6];
      cVar7 = cVar3 + -0x20;
      if (0x19 < (byte)(cVar3 + 0x9fU)) {
        cVar7 = cVar3;
      }
      local_78.name._M_dataplus._M_p[sVar6] = cVar7;
      sVar6 = sVar6 + 1;
    } while (local_78.name._M_string_length != sVar6);
  }
  std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::
  emplace_back<cppforth::Forth::Definition>(&this->definitions,&local_78);
  pDVar5 = getDefinition(this,(int)((ulong)((long)(this->definitions).
                                                  super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(this->definitions).
                                                 super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                              -0x33333333 - 1);
  pDVar5->numberInVector =
       (int)((ulong)((long)(this->definitions).
                           super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->definitions).
                          super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333 - 1;
  pDVar5->searchOrder = this->searchOrderCurrent;
  if (in_R8B != '\0') {
    pDVar4 = (this->definitions).
             super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pCVar1 = &pDVar4[-1].flags;
    *pCVar1 = *pCVar1 | pDVar4[-1].FlagImmediate;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.name._M_dataplus._M_p,
                    CONCAT71(local_78.name.field_2._M_allocated_capacity._1_7_,
                             local_78.name.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void definePrimitive(const char* name, Code code, bool setImmediate) {
			alignDataPointer();

			Definition defn;
			defn.code = code;
			defn.parameter = defn.does = AADDR(getDataPointer());
			defn.name = name;
			for (auto & c: defn.name) c = toupper_ascii(static_cast<unsigned char>(c));
			definitions.emplace_back(std::move(defn));
			auto lastDefinition=getDefinition(CELL(definitions.size()) - 1);
			lastDefinition->numberInVector = CELL(definitions.size()) - 1;
			lastDefinition->searchOrder=searchOrderCurrent;
			if (setImmediate) immediate();
		}